

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EE.hpp
# Opt level: O0

void __thiscall ElectricalEngineering::ElectricalEngineering(ElectricalEngineering *this)

{
  ElectricalEngineering *this_local;
  
  AbstractMajor::AbstractMajor(&this->super_AbstractMajor);
  (this->super_AbstractMajor)._vptr_AbstractMajor = (_func_int **)&PTR_getName_abi_cxx11__0012abc0;
  std::__cxx11::string::operator=((string *)&(this->super_AbstractMajor).name,"ee");
  return;
}

Assistant:

ElectricalEngineering() : AbstractMajor() {
            this->name = "ee";
        }